

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O1

void __thiscall
Fossilize::StateRecorder::init_recording_thread(StateRecorder *this,DatabaseInterface *iface)

{
  undefined4 uVar1;
  Impl *pIVar2;
  long lVar3;
  long lVar4;
  long *in_FS_OFFSET;
  bool bVar5;
  thread local_58;
  long *local_50;
  undefined2 local_48;
  void *local_40;
  undefined8 uStack_38;
  long local_30;
  
  pIVar2 = this->impl;
  pIVar2->database_iface = iface;
  local_50 = (long *)CONCAT71(local_50._1_7_,1);
  local_50 = (long *)((ulong)local_50 & 0xffffffff);
  local_48 = 0x100;
  local_40 = (void *)0x0;
  uStack_38 = 0;
  local_30 = 0;
  (pIVar2->record_data).need_flush = false;
  (pIVar2->record_data).need_prepare = true;
  *(long **)&pIVar2->record_data = local_50;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_move_assign
            (&(pIVar2->record_data).blob,&local_40);
  if (local_40 != (void *)0x0) {
    operator_delete(local_40,local_30 - (long)local_40);
  }
  pIVar2 = this->impl;
  if (pIVar2->module_identifier_database_iface == (DatabaseInterface *)0x0) {
    bVar5 = false;
  }
  else {
    bVar5 = pIVar2->on_use_database_iface != (DatabaseInterface *)0x0;
  }
  pIVar2->should_record_identifier_only = bVar5;
  lVar3 = *in_FS_OFFSET;
  uVar1 = *(undefined4 *)(lVar3 + -0x18);
  lVar4 = *(long *)(lVar3 + -0x10);
  lVar3 = *(long *)(lVar3 + -8);
  local_58._M_id._M_thread = (id)0;
  local_50 = (long *)operator_new(0x28);
  *local_50 = (long)&PTR___State_0016cbc0;
  *(undefined4 *)(local_50 + 1) = uVar1;
  local_50[2] = lVar4;
  local_50[3] = lVar3;
  local_50[4] = (long)this;
  std::thread::_M_start_thread(&local_58,&local_50,0);
  if (local_50 != (long *)0x0) {
    (**(code **)(*local_50 + 8))();
  }
  if ((this->impl->worker_thread)._M_id._M_thread == 0) {
    (this->impl->worker_thread)._M_id._M_thread = (native_handle_type)local_58._M_id._M_thread;
    return;
  }
  std::terminate();
}

Assistant:

void StateRecorder::init_recording_thread(DatabaseInterface *iface)
{
	impl->database_iface = iface;
	impl->record_data = {};
	impl->should_record_identifier_only =
			impl->module_identifier_database_iface && impl->on_use_database_iface;

	auto level = get_thread_log_level();
	auto cb = Internal::get_thread_log_callback();
	auto userdata = Internal::get_thread_log_userdata();
	impl->worker_thread = std::thread([=]() {
		set_thread_log_level(level);
		set_thread_log_callback(cb, userdata);
		impl->record_task(this, true);
	});
}